

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

void invdisp_nothing(char *hdr,char *txt)

{
  nh_menuitem *_item_;
  nh_menuitem items [3];
  
  items[0].id = 0;
  items[0].role = MI_HEADING;
  items[0].accel = '\0';
  items[0].group_accel = '\0';
  items[0].selected = '\0';
  strcpy(items[0].caption,hdr);
  items[1].id = 0;
  items[1].role = MI_NORMAL;
  items[1].accel = '\0';
  items[1].group_accel = '\0';
  items[1].selected = '\0';
  items[1].caption[0] = '\0';
  items[2].id = 0;
  items[2].role = MI_NORMAL;
  items[2].accel = '\0';
  items[2].group_accel = '\0';
  items[2].selected = '\0';
  strcpy(items[2].caption,txt);
  display_menu(items,3,(char *)0x0,0,(int *)0x0);
  return;
}

Assistant:

static void invdisp_nothing(const char *hdr, const char *txt)
{
	struct nh_menuitem items[3];
	
	set_menuitem(&items[0], 0, MI_HEADING, hdr, 0, FALSE);
	set_menuitem(&items[1], 0, MI_NORMAL, "", 0, FALSE);
	set_menuitem(&items[2], 0, MI_NORMAL, txt, 0, FALSE);
	
	display_menu(items, 3, NULL, PICK_NONE, NULL);
	
	return;
}